

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O3

bool __thiscall GGSock::FileServer::addFile(FileServer *this,FileData *data)

{
  int *piVar1;
  ulong *puVar2;
  _Head_base<0UL,_GGSock::FileServer::Impl_*,_false> _Var3;
  long lVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  pthread_mutex_t *__mutex;
  int iVar8;
  long lVar9;
  long lVar10;
  
  __mutex = (pthread_mutex_t *)
            &((this->m_impl)._M_t.
              super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
              .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->mutex;
  iVar6 = pthread_mutex_lock(__mutex);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  if ((data->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      (data->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    bVar5 = Impl::exists((this->m_impl)._M_t.
                         super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                         .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl,
                         &data->info);
    if (!bVar5) {
      _Var3._M_head_impl =
           (this->m_impl)._M_t.
           super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
           .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
      iVar6 = (_Var3._M_head_impl)->currentFileUpdateId;
      lVar4 = *(long *)&((_Var3._M_head_impl)->files).
                        super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
      ;
      if (iVar6 != (int)((ulong)((long)*(pointer *)((long)&(_Var3._M_head_impl)->files + 8) - lVar4)
                        >> 3) * -0x3b13b13b) {
        iVar7 = (data->info).nChunks;
        if (iVar7 == 0) {
          iVar7 = *(int32_t *)((long)&(_Var3._M_head_impl)->parameters + 0xc);
          (data->info).nChunks = iVar7;
        }
        lVar9 = (long)(data->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(data->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        iVar8 = (int)lVar9;
        if (iVar8 < iVar7) {
          (data->info).nChunks = iVar8;
        }
        (data->info).filesize = lVar9;
        iVar7 = iVar6 + 0x3f;
        if (-1 < iVar6) {
          iVar7 = iVar6;
        }
        puVar2 = (ulong *)((long)(iVar7 >> 6) * 8 +
                           *(long *)&((_Var3._M_head_impl)->fileUsed).
                                     super__Bvector_base<std::allocator<bool>_> + -8 +
                          (ulong)(((long)iVar6 & 0x800000000000003fU) < 0x8000000000000001) * 8);
        *puVar2 = *puVar2 | 1L << ((byte)iVar6 & 0x3f);
        lVar10 = (long)iVar6 * 0x68;
        std::__cxx11::string::operator=((string *)(lVar10 + lVar4),(string *)data);
        lVar9 = lVar10 + lVar4;
        *(TFilesize *)(lVar9 + 0x20) = (data->info).filesize;
        std::__cxx11::string::operator=((string *)(lVar9 + 0x28),(string *)&(data->info).filename);
        *(int32_t *)(lVar9 + 0x48) = (data->info).nChunks;
        std::vector<char,_std::allocator<char>_>::_M_move_assign
                  ((vector<char,_std::allocator<char>_> *)(lVar10 + lVar4 + 0x50),&data->data);
        _Var3._M_head_impl =
             (this->m_impl)._M_t.
             super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
             .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
        piVar1 = &(_Var3._M_head_impl)->currentFileUpdateId;
        *piVar1 = *piVar1 + 1;
        (_Var3._M_head_impl)->changedFileInfos = true;
        bVar5 = true;
        goto LAB_0010ce0c;
      }
    }
  }
  bVar5 = false;
LAB_0010ce0c:
  pthread_mutex_unlock(__mutex);
  return bVar5;
}

Assistant:

bool FileServer::addFile(FileData && data) {
    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);

        if (data.data.size() == 0) {
            return false;
        }

        if (m_impl->exists(data.info)) {
            return false;
        }

        // todo : handle max files reached
        if (m_impl->currentFileUpdateId == (int) m_impl->files.size()) {
            return false;
        }

        if (data.info.nChunks == 0) {
            data.info.nChunks = m_impl->parameters.nDefaultFileChunks;
        }

        if (data.info.nChunks > (int32_t) data.data.size()) {
            data.info.nChunks = (int32_t) data.data.size();
        }

        data.info.filesize = data.data.size();

        m_impl->fileUsed[m_impl->currentFileUpdateId] = true;
        m_impl->files[m_impl->currentFileUpdateId] = std::move(data);

        m_impl->currentFileUpdateId++;

        m_impl->changedFileInfos = true;
    }

    return true;
}